

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsOnListOfPiecesOfCinematography.h
# Opt level: O2

void OperationsOnListOfPiecesOfCinematography<Series>::addPiece
               (Series *piece,
               vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_> *list)

{
  pointer *pppPVar1;
  char cVar2;
  PieceOfCinematography *pPVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  istream *piVar8;
  Series *this;
  Livestream *this_00;
  CustomException *pCVar9;
  double rating;
  string hour;
  string inputValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genres;
  char *local_1f0 [4];
  string title;
  string local_1b0;
  char *local_190 [4];
  string local_170;
  string genre;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  title._M_dataplus._M_p = (pointer)&title.field_2;
  title._M_string_length = 0;
  genre._M_dataplus._M_p = (pointer)&genre.field_2;
  genre._M_string_length = 0;
  inputValue._M_dataplus._M_p = (pointer)&inputValue.field_2;
  inputValue._M_string_length = 0;
  title.field_2._M_local_buf[0] = '\0';
  genre.field_2._M_local_buf[0] = '\0';
  inputValue.field_2._M_local_buf[0] = '\0';
  genres.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  genres.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  genres.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PieceOfCinematography::setFollowed(&piece->super_PieceOfCinematography,false);
  PieceOfCinematography::setId
            (&piece->super_PieceOfCinematography,
             (int)((ulong)((long)(list->
                                 super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(list->
                                super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
  poVar7 = std::operator<<((ostream *)&std::cout,"set the title of the piece of cinematography:");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator>>((istream *)&std::cin,(string *)&title);
  std::__cxx11::string::string((string *)&local_170,(string *)&title);
  PieceOfCinematography::setTitle(&piece->super_PieceOfCinematography,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  poVar7 = std::operator<<((ostream *)&std::cout,"set the rating for the piece of cinematography:");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator>>((istream *)&std::cin,(string *)&inputValue);
  rating = atof(inputValue._M_dataplus._M_p);
  if ((10.0 < rating) || (rating < 0.0)) {
    pCVar9 = (CustomException *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string((string *)&local_50,"wrong rating",(allocator *)&hour);
    CustomException::CustomException(pCVar9,&local_50);
    __cxa_throw(pCVar9,&CustomException::typeinfo,CustomException::~CustomException);
  }
  PieceOfCinematography::setRating(&piece->super_PieceOfCinematography,rating);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "set the number of votes for the piece of cinematography:");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator>>((istream *)&std::cin,(string *)&inputValue);
  iVar5 = atoi(inputValue._M_dataplus._M_p);
  if (iVar5 < 0) {
    pCVar9 = (CustomException *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&local_70,"Number of votes can not be lower than 0",(allocator *)&hour);
    CustomException::CustomException(pCVar9,&local_70);
    __cxa_throw(pCVar9,&CustomException::typeinfo,CustomException::~CustomException);
  }
  PieceOfCinematography::setNumberOfVotes(&piece->super_PieceOfCinematography,iVar5);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "set the year of production for the piece of cinematography:");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator>>((istream *)&std::cin,(string *)&inputValue);
  iVar5 = atoi(inputValue._M_dataplus._M_p);
  if (iVar5 < 0) {
    pCVar9 = (CustomException *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&local_90,"Year of production can not be lower than 0",(allocator *)&hour);
    CustomException::CustomException(pCVar9,&local_90);
    __cxa_throw(pCVar9,&CustomException::typeinfo,CustomException::~CustomException);
  }
  PieceOfCinematography::setYearProduced(&piece->super_PieceOfCinematography,iVar5);
  poVar7 = std::operator<<((ostream *)&std::cout,"set the duration of the piece of cinematography:")
  ;
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator>>((istream *)&std::cin,(string *)&inputValue);
  iVar6 = atoi(inputValue._M_dataplus._M_p);
  if (iVar6 < 0) {
    pCVar9 = (CustomException *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&local_b0,"Duration can not be lower than 0",(allocator *)&hour);
    CustomException::CustomException(pCVar9,&local_b0);
    __cxa_throw(pCVar9,&CustomException::typeinfo,CustomException::~CustomException);
  }
  PieceOfCinematography::setDuration(&piece->super_PieceOfCinematography,iVar6);
  poVar7 = std::operator<<((ostream *)&std::cout,"set the genres of the piece of cinematography:");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"To set each genre type it and then press enter.");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "To finish setting the genres type \"apply\" and press enter.");
  std::endl<char,std::char_traits<char>>(poVar7);
  while( true ) {
    piVar8 = std::operator>>((istream *)&std::cin,(string *)&genre);
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
    bVar4 = std::operator==(&genre,"apply");
    if (bVar4) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&genres,&genre);
  }
  PieceOfCinematography::setGenres(&piece->super_PieceOfCinematography,&genres);
  hour._M_dataplus._M_p = (pointer)piece;
  std::vector<PieceOfCinematography*,std::allocator<PieceOfCinematography*>>::
  emplace_back<PieceOfCinematography*>
            ((vector<PieceOfCinematography*,std::allocator<PieceOfCinematography*>> *)list,
             (PieceOfCinematography **)&hour);
  bVar4 = instanceof<Series,PieceOfCinematography>
                    ((list->
                     super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1]);
  pPVar3 = (list->
           super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>).
           _M_impl.super__Vector_impl_data._M_finish[-1];
  if (bVar4) {
    if (pPVar3 == (PieceOfCinematography *)0x0) {
      this = (Series *)0x0;
    }
    else {
      this = (Series *)__dynamic_cast(pPVar3,&PieceOfCinematography::typeinfo,&Series::typeinfo,0);
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"set the year the show ended:");
    std::endl<char,std::char_traits<char>>(poVar7);
    std::operator>>((istream *)&std::cin,(string *)&inputValue);
    iVar6 = atoi(inputValue._M_dataplus._M_p);
    if (iVar6 < 0) {
      pppPVar1 = &(list->
                  super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + -1;
      pCVar9 = (CustomException *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_d0,"Year the show ended can not be lower than 0",
                 (allocator *)&hour);
      CustomException::CustomException(pCVar9,&local_d0);
      __cxa_throw(pCVar9,&CustomException::typeinfo,CustomException::~CustomException);
    }
    Series::setYearTheShowEnded(this,iVar6);
    Series::setNumberOfSeasons(this,(iVar6 - iVar5) + 1);
  }
  else {
    bVar4 = instanceof<Livestream,PieceOfCinematography>(pPVar3);
    if (bVar4) {
      pPVar3 = (list->
               super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1];
      if (pPVar3 == (PieceOfCinematography *)0x0) {
        this_00 = (Livestream *)0x0;
      }
      else {
        this_00 = (Livestream *)
                  __dynamic_cast(pPVar3,&PieceOfCinematography::typeinfo,&Livestream::typeinfo,0);
      }
      poVar7 = std::operator<<((ostream *)&std::cout,"set the month of livestream: ");
      std::endl<char,std::char_traits<char>>(poVar7);
      std::operator>>((istream *)&std::cin,(string *)&inputValue);
      iVar5 = atoi(inputValue._M_dataplus._M_p);
      if (iVar5 - 0xdU < 0xfffffff4) {
        pppPVar1 = &(list->
                    super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + -1;
        pCVar9 = (CustomException *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string((string *)&local_f0,"Invalid month",(allocator *)&hour);
        CustomException::CustomException(pCVar9,&local_f0);
        __cxa_throw(pCVar9,&CustomException::typeinfo,CustomException::~CustomException);
      }
      Livestream::setMonth(this_00,iVar5);
      poVar7 = std::operator<<((ostream *)&std::cout,"set the day of livestream: ");
      std::endl<char,std::char_traits<char>>(poVar7);
      std::operator>>((istream *)&std::cin,(string *)&inputValue);
      iVar5 = atoi(inputValue._M_dataplus._M_p);
      if (iVar5 - 0x20U < 0xffffffe1) {
        pppPVar1 = &(list->
                    super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + -1;
        pCVar9 = (CustomException *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string((string *)&local_110,"Invalid day",(allocator *)&hour);
        CustomException::CustomException(pCVar9,&local_110);
        __cxa_throw(pCVar9,&CustomException::typeinfo,CustomException::~CustomException);
      }
      Livestream::setDay(this_00,iVar5);
      hour._M_dataplus._M_p = (pointer)&hour.field_2;
      hour._M_string_length = 0;
      hour.field_2._M_local_buf[0] = '\0';
      poVar7 = std::operator<<((ostream *)&std::cout,"set hour of livestream hh:mm e. g. \"21:37\"")
      ;
      std::endl<char,std::char_traits<char>>(poVar7);
      std::operator>>((istream *)&std::cin,(string *)&hour);
      if (hour._M_string_length < 6) {
        std::__cxx11::string::substr((ulong)local_1f0,(ulong)&hour);
        iVar5 = atoi(local_1f0[0]);
        if (iVar5 < 0x18) {
          std::__cxx11::string::substr((ulong)local_190,(ulong)&hour);
          iVar5 = atoi(local_190[0]);
          if (iVar5 < 0x3c) {
            cVar2 = hour._M_dataplus._M_p[2];
            std::__cxx11::string::~string((string *)local_190);
            std::__cxx11::string::~string((string *)local_1f0);
            if (cVar2 == ':') {
              std::__cxx11::string::string((string *)&local_1b0,(string *)&hour);
              Livestream::setHour(this_00,&local_1b0);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::__cxx11::string::~string((string *)&hour);
              goto LAB_001081ff;
            }
            goto LAB_001084bd;
          }
          std::__cxx11::string::~string((string *)local_190);
        }
        std::__cxx11::string::~string((string *)local_1f0);
      }
LAB_001084bd:
      pppPVar1 = &(list->
                  super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + -1;
      pCVar9 = (CustomException *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)&local_130,"Invalid hour",(allocator *)local_1f0);
      CustomException::CustomException(pCVar9,&local_130);
      __cxa_throw(pCVar9,&CustomException::typeinfo,CustomException::~CustomException);
    }
  }
LAB_001081ff:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&genres);
  std::__cxx11::string::~string((string *)&inputValue);
  std::__cxx11::string::~string((string *)&genre);
  std::__cxx11::string::~string((string *)&title);
  return;
}

Assistant:

static void addPiece(T *piece, vector<PieceOfCinematography *> &list) {
        string title;
        double rating;
        int numberOfVotes, yearProduced, duration;
        string genre;
        string inputValue;
        vector<string> genres;
        try {
            piece->setFollowed(0);
            piece->setId(list.size() + 1);
            cout << "set the title of the piece of cinematography:" << endl;
            cin >> title;
            piece->setTitle(title);
            cout << "set the rating for the piece of cinematography:" << endl;
            cin >> inputValue;
            rating = atof(inputValue.c_str());
            if(rating>10 || rating<0) throw CustomException("wrong rating");
            piece->setRating(rating);
            cout << "set the number of votes for the piece of cinematography:" << endl;
            cin >> inputValue;
            numberOfVotes = atoi(inputValue.c_str());
            if(numberOfVotes<0) throw CustomException("Number of votes can not be lower than 0");
            piece->setNumberOfVotes(numberOfVotes);
            cout << "set the year of production for the piece of cinematography:" << endl;
            cin >> inputValue;
            yearProduced=atoi(inputValue.c_str());
            if(yearProduced<0) throw CustomException("Year of production can not be lower than 0");
            piece->setYearProduced(yearProduced);
            cout << "set the duration of the piece of cinematography:" << endl;
            cin >> inputValue;
            duration=atoi(inputValue.c_str());
            if(duration<0) throw CustomException("Duration can not be lower than 0");
            piece->setDuration(duration);
            cout << "set the genres of the piece of cinematography:" << endl;
            cout << "To set each genre type it and then press enter." << endl;
            cout << "To finish setting the genres type \"apply\" and press enter." << endl;
            while (cin >> genre) {
                if (genre == "apply") break;
                genres.push_back(genre);
            }
            piece->setGenres(genres);
            list.push_back(dynamic_cast<T *>(piece));
            if (instanceof<Series>(list[list.size() - 1])) {
                Series *s = dynamic_cast<Series *>(list[list.size() - 1]);
                int yearTheShowEnded = 0;
                cout << "set the year the show ended:" << endl;
                cin >> inputValue;
                yearTheShowEnded = atoi(inputValue.c_str());
                if(yearTheShowEnded<0){
                    list.pop_back();
                    throw CustomException("Year the show ended can not be lower than 0");
                }
                s->setYearTheShowEnded(yearTheShowEnded);
                s->setNumberOfSeasons(yearTheShowEnded - yearProduced + 1);
            } else if (instanceof<Livestream>(list[list.size() - 1])) {
                Livestream *l = dynamic_cast<Livestream *>(list[list.size() - 1]);
                int month;
                cout << "set the month of livestream: " << endl;
                cin >> inputValue;
                month = atoi(inputValue.c_str());
                if(month<1 || month >12){
                    list.pop_back();
                    throw CustomException("Invalid month");
                }
                l->setMonth(month);
                cout << "set the day of livestream: " << endl;
                int day;
                cin >> inputValue;
                day = atoi(inputValue.c_str());
                if(day<1 || day >31){
                    list.pop_back();
                    throw CustomException("Invalid day");
                }
                l->setDay(day);
                string hour;
                cout << "set hour of livestream hh:mm e. g. \"21:37\"" << endl;
                cin >> hour;
                if(hour.size()>5 || atoi(hour.substr(0,2).c_str())>23 || atoi(hour.substr(3,2).c_str())>59 || hour[2]!=':'){
                    list.pop_back();
                    throw CustomException("Invalid hour");
                }
                l->setHour(hour);
            }
        } catch(CustomException &e){
            cout<<e.getMessage()<<endl<<endl;
        }
    }